

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::JSExtensionsObjectName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,GeneratorOptions *options,
          FileDescriptor *from_file,Descriptor *desc)

{
  long lVar1;
  int iVar2;
  long *plVar3;
  string *extraout_RAX;
  string *extraout_RAX_00;
  string *psVar4;
  size_type *psVar5;
  string local_48;
  
  iVar2 = std::__cxx11::string::compare(*(char **)(from_file + 8));
  if (iVar2 != 0) {
    MaybeCrossFileRef_abi_cxx11_(&local_48,this,options,from_file,desc);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_48);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar5 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar5) {
      lVar1 = plVar3[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    }
    __return_storage_ptr__->_M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    psVar4 = (string *)&local_48.field_2;
    if ((string *)local_48._M_dataplus._M_p != psVar4) {
      operator_delete(local_48._M_dataplus._M_p);
      psVar4 = extraout_RAX_00;
    }
    return psVar4;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,"jspb.Message.messageSetExtensions","");
  return extraout_RAX;
}

Assistant:

std::string JSExtensionsObjectName(const GeneratorOptions& options,
                                   const FileDescriptor* from_file,
                                   const Descriptor* desc) {
  if (desc->full_name() == "google.protobuf.bridge.MessageSet") {
    // TODO(haberman): fix this for the kImportCommonJs case.
    return "jspb.Message.messageSetExtensions";
  } else {
    return MaybeCrossFileRef(options, from_file, desc) + ".extensions";
  }
}